

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamWriter::writeDTD(QXmlStreamWriter *this,QAnyStringView dtd)

{
  QXmlStreamWriterPrivate *this_00;
  char *str;
  QAnyStringView *this_01;
  size_t in_RCX;
  void *in_RDX;
  undefined8 in_RSI;
  QXmlStreamWriterPrivate *in_RDI;
  long in_FS_OFFSET;
  QXmlStreamWriterPrivate *d;
  qsizetype in_stack_ffffffffffffff50;
  int *len;
  char *in_stack_ffffffffffffff58;
  QAnyStringView *in_stack_ffffffffffffff60;
  QXmlStreamWriterPrivate *this_02;
  int local_48 [2];
  void *local_40;
  undefined8 local_38;
  void *local_30;
  int local_28;
  void *local_20;
  undefined8 local_18;
  void *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RSI;
  local_10 = in_RDX;
  this_00 = d_func((QXmlStreamWriter *)0x64f3bb);
  QXmlStreamWriterPrivate::finishStartElement(in_RDI,SUB81((ulong)this_00 >> 0x38,0));
  this_02 = this_00;
  if ((*(ushort *)&this_00->field_0x78 >> 7 & 1) != 0) {
    std::data<char_const,2ul>((char (*) [2])0x938dd4);
    QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x64f432);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    QXmlStreamWriterPrivate::write(this_00,local_28,local_20,in_RCX);
  }
  local_38 = local_18;
  local_30 = local_10;
  QXmlStreamWriterPrivate::write(this_02,(int)local_18,local_10,in_RCX);
  if ((*(ushort *)&this_02->field_0x78 >> 7 & 1) != 0) {
    len = local_48;
    str = std::data<char_const,2ul>((char (*) [2])0x938dd4);
    this_01 = (QAnyStringView *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x64f508);
    QAnyStringView::QAnyStringView<char,_true>(this_01,str,(qsizetype)len);
    QXmlStreamWriterPrivate::write(this_02,local_48[0],local_40,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriter::writeDTD(QAnyStringView dtd)
{
    Q_D(QXmlStreamWriter);
    d->finishStartElement();
    if (d->autoFormatting)
        d->write("\n");
    d->write(dtd);
    if (d->autoFormatting)
        d->write("\n");
}